

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O1

U32 ZSTD_litLengthPrice(U32 litLength,optState_t *optPtr,int optLevel)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  
  if (optPtr->priceType != zop_predef) {
    if (litLength < 0x40) {
      uVar2 = (uint)(byte)ZSTD_LLcode_LL_Code[litLength];
    }
    else {
      uVar2 = 0x1f;
      if (litLength != 0) {
        for (; litLength >> uVar2 == 0; uVar2 = uVar2 - 1) {
        }
      }
      uVar2 = (uVar2 ^ 0xffffffe0) + 0x33;
    }
    uVar3 = optPtr->litLengthFreq[uVar2] + 1;
    uVar1 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    if (optLevel == 0) {
      iVar4 = (uVar1 ^ 0x1f) * 0x100 + -0x1f00;
    }
    else {
      iVar4 = -((uVar3 * 0x100 >> ((byte)uVar1 & 0x1f)) + uVar1 * 0x100);
    }
    return LL_bits[uVar2] * 0x100 + optPtr->litLengthSumBasePrice + iVar4;
  }
  uVar2 = litLength + 1;
  iVar4 = 0x1f;
  if (uVar2 != 0) {
    for (; uVar2 >> iVar4 == 0; iVar4 = iVar4 + -1) {
    }
  }
  if (optLevel != 0) {
    return (uVar2 * 0x100 >> ((byte)iVar4 & 0x1f)) + iVar4 * 0x100;
  }
  return iVar4 << 8;
}

Assistant:

static U32 ZSTD_litLengthPrice(U32 const litLength, const optState_t* const optPtr, int optLevel)
{
    if (optPtr->priceType == zop_predef) return WEIGHT(litLength, optLevel);

    /* dynamic statistics */
    {   U32 const llCode = ZSTD_LLcode(litLength);
        return (LL_bits[llCode] * BITCOST_MULTIPLIER)
             + optPtr->litLengthSumBasePrice
             - WEIGHT(optPtr->litLengthFreq[llCode], optLevel);
    }
}